

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O3

int stb__wildmatch_raw2(char *expr,char *candidate,int search,int insensitive)

{
  char *pcVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  __int32_t **pp_Var5;
  long lVar6;
  long lVar7;
  char cVar8;
  char cVar9;
  char *pcVar10;
  char *qstring;
  char *pcVar11;
  char cVar12;
  int iVar13;
  long local_40;
  
  cVar9 = *expr;
  if (search == 0) {
    iVar3 = -(uint)(cVar9 == '*');
    local_40 = 0;
    do {
      if (cVar9 == '?') {
        if (candidate[local_40] == '\0') goto LAB_00156dd0;
      }
      else {
        if (cVar9 == '*') {
          candidate = candidate + local_40;
          expr = expr + local_40;
          goto LAB_00156b77;
        }
        if (cVar9 == '\0') {
          return -(uint)(candidate[local_40] != '\0');
        }
        if (insensitive == 0) {
          if (candidate[local_40] != cVar9) goto LAB_00156dd0;
        }
        else {
          pp_Var5 = __ctype_tolower_loc();
          if ((*pp_Var5)[candidate[local_40]] != (*pp_Var5)[cVar9]) goto LAB_00156dd0;
        }
      }
      cVar9 = expr[local_40 + 1];
      local_40 = local_40 + 1;
    } while( true );
  }
  iVar3 = -1;
  local_40 = 0;
  if (cVar9 == '\0') {
    return 0;
  }
LAB_00156b77:
  qstring = expr + (search == 0);
  cVar9 = *qstring;
  while (cVar9 != '\0') {
    while (pcVar11 = qstring + 1, cVar9 == '*') {
      qstring = pcVar11;
      cVar9 = *pcVar11;
    }
    if (cVar9 == '\0') break;
    lVar7 = 0;
    while ((cVar9 != '\0' && (cVar9 != '*'))) {
      pcVar10 = pcVar11 + lVar7;
      lVar7 = lVar7 + 1;
      cVar9 = *pcVar10;
    }
    iVar4 = (int)lVar7;
    if ((search == 0) && (cVar9 == '\0')) {
      if (lVar7 == 0) goto LAB_00156da2;
      lVar6 = 0;
      goto LAB_00156d93;
    }
    lVar6 = 0;
    pcVar10 = candidate + 1;
    while( true ) {
      cVar12 = *qstring;
      if ((long)cVar12 != 0x3f) break;
      if (iVar4 - 1U == (uint)lVar6) {
        iVar13 = 0;
        goto LAB_00156cc4;
      }
      qstring = qstring + 1;
      pcVar10 = pcVar10 + 1;
      pcVar1 = candidate + 1 + lVar6;
      lVar6 = lVar6 + 1;
      if (*pcVar1 == '\0') goto LAB_00156dd0;
    }
    if (insensitive != 0) {
      pp_Var5 = __ctype_tolower_loc();
      cVar12 = (char)(*pp_Var5)[cVar12];
    }
    cVar8 = candidate[lVar6];
    if (cVar8 == '\0') goto LAB_00156dd0;
    iVar13 = 0;
    while( true ) {
      if (insensitive == 0) {
        iVar2 = (int)cVar8;
      }
      else {
        pp_Var5 = __ctype_tolower_loc();
        iVar2 = (*pp_Var5)[cVar8];
      }
      if ((iVar2 == cVar12) &&
         (iVar2 = stb__match_qstring(pcVar10,pcVar11 + lVar6,~(uint)lVar6 + iVar4,insensitive),
         iVar2 != 0)) break;
      cVar8 = *pcVar10;
      pcVar10 = pcVar10 + 1;
      iVar13 = iVar13 + 1;
      if (cVar8 == '\0') goto LAB_00156dd0;
    }
LAB_00156cc4:
    if (iVar3 < 0) {
      iVar3 = (int)local_40 + iVar13;
    }
    if (cVar9 != '*') {
      if (cVar9 != '\0') {
        __assert_fail("*expr == \'*\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb.h"
                      ,0x2325,"int stb__wildmatch_raw2(char *, char *, int, int)");
      }
      if (search != 0) {
        return iVar3;
      }
      __assert_fail("search",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb.h"
                    ,0x2321,"int stb__wildmatch_raw2(char *, char *, int, int)");
    }
    candidate = candidate + (uint)(iVar13 + iVar4);
    qstring = pcVar11 + lVar7;
    cVar9 = pcVar11[lVar7];
  }
  if (iVar3 < 1) {
    return 0;
  }
  return iVar3;
  while (lVar6 = lVar6 + 1, lVar7 != lVar6) {
LAB_00156d93:
    if (candidate[lVar6] == '\0') goto LAB_00156dd0;
  }
LAB_00156da2:
  pcVar11 = candidate + -1;
  do {
    pcVar10 = pcVar11 + lVar7 + 1;
    pcVar11 = pcVar11 + 1;
  } while (*pcVar10 != '\0');
  iVar4 = stb__match_qstring(pcVar11,qstring,iVar4,insensitive);
  if (iVar4 == 0) {
LAB_00156dd0:
    iVar4 = -1;
  }
  else {
    iVar4 = 0;
    if (0 < iVar3) {
      iVar4 = iVar3;
    }
  }
  return iVar4;
}

Assistant:

int stb__wildmatch_raw2(char *expr, char *candidate, int search, int insensitive)
{
   int where=0;
   int start = -1;
   
   if (!search) {
      // parse to first '*'
      if (*expr != '*')
         start = 0;
      while (*expr != '*') {
         if (!*expr)
            return *candidate == 0 ? 0 : -1;
         if (*expr == '?') {
            if (!*candidate) return -1;
         } else {
            if (insensitive) {
               if (tolower(*candidate) != tolower(*expr))
                  return -1;
            } else 
               if (*candidate != *expr)
                  return -1;
         }
         ++candidate, ++expr, ++where;
      }
   } else {
      // 0-length search string
      if (!*expr)
         return 0;
   }

   assert(search || *expr == '*');
   if (!search)
      ++expr;

   // implicit '*' at this point
      
   while (*expr) {
      int o=0;
      // combine redundant * characters
      while (expr[0] == '*') ++expr;

      // ok, at this point, expr[-1] == '*',
      // and expr[0] != '*'

      if (!expr[0]) return start >= 0 ? start : 0;

      // now find next '*'
      o = 0;
      while (expr[o] != '*') {
         if (expr[o] == 0)
            break;
         ++o;
      }
      // if no '*', scan to end, then match at end
      if (expr[o] == 0 && !search) {
         int z;
         for (z=0; z < o; ++z)
            if (candidate[z] == 0)
               return -1;
         while (candidate[z])
            ++z;
         // ok, now check if they match
         if (stb__match_qstring(candidate+z-o, expr, o, insensitive))
            return start >= 0 ? start : 0;
         return -1; 
      } else {
         // if yes '*', then do stb__find_qmatch on the intervening chars
         int n = stb__find_qstring(candidate, expr, o, insensitive);
         if (n < 0)
            return -1;
         if (start < 0)
            start = where + n;
         expr += o;
         candidate += n+o;
      }

      if (*expr == 0) {
         assert(search);
         return start;
      }

      assert(*expr == '*');
      ++expr;
   }

   return start >= 0 ? start : 0;
}